

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

void __thiscall TestMaterial::GeneralTest(TestMaterial *this)

{
  Vector3T *pVVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  clock_t cVar9;
  clock_t cVar10;
  clock_t cVar11;
  ostream *poVar12;
  long lVar13;
  ulong uVar14;
  long i;
  long i_1;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 uVar15;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 uVar16;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  double angle;
  Vector3T<double,_false> vr;
  CD_Scene testscene;
  Point3 p;
  fstream outfile;
  double local_370;
  double local_368;
  double dStack_360;
  double local_358;
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  double local_328;
  double dStack_320;
  double local_318;
  double local_308;
  double dStack_300;
  double local_2f8;
  TestMaterial *local_2e8;
  ulong local_2e0;
  undefined4 local_2d8;
  undefined4 uStack_2d4;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  CD_Scene local_2c0 [8];
  long local_2b8;
  undefined1 local_258 [24];
  long local_240;
  undefined8 auStack_238 [65];
  
  std::fstream::fstream(&local_240);
  std::fstream::open((char *)&local_240,0x10529c);
  *(undefined8 *)((long)auStack_238 + *(long *)(local_240 + -0x18)) = 0x12;
  if ((this->stppObjects).super__Vector_base<sch::STP_BV_P,_std::allocator<sch::STP_BV_P>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->stppObjects).super__Vector_base<sch::STP_BV_P,_std::allocator<sch::STP_BV_P>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar14 = 0;
    local_2d8 = 0;
    uStack_2d4 = 0;
    uStack_2d0 = 0x55555556;
    uStack_2cc = 0x3fd55555;
    local_2e8 = this;
    do {
      sch::CD_Scene::CD_Scene(local_2c0);
      sch::CD_Scene::addObject((S_Object *)local_2c0);
      sch::S_Object::resetTransformation();
      sch::CD_Scene::addObject((S_Object *)local_2c0);
      local_308 = (double)CONCAT44(uStack_2d4,local_2d8);
      dStack_300 = (double)CONCAT44(uStack_2cc,uStack_2d0);
      local_2f8 = 0.28571428571428575;
      local_368 = 0.0;
      dStack_360 = 0.0;
      local_358 = 1.0;
      local_370 = 0.0;
      local_2e0 = uVar14;
      sch::S_Object::setOrientation(*(double **)(local_2b8 + 8),(Vector3T *)&local_370);
      sch::S_Object::setPosition(*(Vector3T **)(local_2b8 + 8));
      sch::CD_Scene::sceneProximityQuery();
      display();
      clock();
      lVar13 = 1000000;
      do {
        iVar5 = rand();
        iVar6 = rand();
        iVar7 = rand();
        iVar8 = rand();
        dVar2 = log((double)iVar5 / 2147483647.0);
        if (dVar2 * -2.0 < 0.0) {
          sqrt(dVar2 * -2.0);
        }
        cos(((double)iVar6 / 2147483647.0) * 6.283185307179586);
        dVar2 = log((double)iVar6 / 2147483647.0);
        if (dVar2 * -2.0 < 0.0) {
          sqrt(dVar2 * -2.0);
        }
        cos(((double)iVar5 / 2147483647.0) * 6.283185307179586);
        dVar2 = log((double)iVar7 / 2147483647.0);
        if (dVar2 * -2.0 < 0.0) {
          sqrt(dVar2 * -2.0);
        }
        cos(((double)iVar8 / 2147483647.0) * 6.283185307179586);
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
      clock();
      clock();
      lVar13 = 1000000;
      do {
        iVar5 = rand();
        iVar6 = rand();
        iVar7 = rand();
        iVar8 = rand();
        dVar2 = log((double)iVar5 / 2147483647.0);
        dVar2 = dVar2 * -2.0;
        if (dVar2 < 0.0) {
          dVar2 = sqrt(dVar2);
        }
        else {
          dVar2 = SQRT(dVar2);
        }
        local_348._0_8_ = (double)iVar6 / 2147483647.0;
        dVar3 = cos(((double)iVar6 / 2147483647.0) * 6.283185307179586);
        local_338._8_4_ = extraout_XMM0_Dc;
        local_338._0_8_ = dVar3;
        local_338._12_4_ = extraout_XMM0_Dd;
        dVar3 = log((double)local_348._0_8_);
        dVar3 = dVar3 * -2.0;
        if (dVar3 < 0.0) {
          dVar3 = sqrt(dVar3);
          uVar15 = extraout_XMM0_Dc_01;
          uVar16 = extraout_XMM0_Dd_01;
        }
        else {
          dVar3 = SQRT(dVar3);
          uVar15 = extraout_XMM0_Dc_00;
          uVar16 = extraout_XMM0_Dd_00;
        }
        local_348._8_4_ = uVar15;
        local_348._0_8_ = dVar3;
        local_348._12_4_ = uVar16;
        dVar3 = cos(((double)iVar5 / 2147483647.0) * 6.283185307179586);
        dVar4 = log((double)iVar7 / 2147483647.0);
        dVar4 = dVar4 * -2.0;
        if (dVar4 < 0.0) {
          dVar4 = sqrt(dVar4);
        }
        else {
          dVar4 = SQRT(dVar4);
        }
        local_318 = cos(((double)iVar8 / 2147483647.0) * 6.283185307179586);
        local_318 = local_318 * dVar4;
        local_328 = (double)local_338._0_8_ * dVar2;
        dStack_320 = dVar3 * (double)local_348._0_8_;
        (**(code **)(**(long **)(local_2b8 + 8) + 0x20))
                  (local_258,*(long **)(local_2b8 + 8),&local_328);
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
      clock();
      cVar9 = clock();
      uVar14 = local_2e0;
      lVar13 = 0;
      do {
        dVar2 = (double)lVar13;
        dVar3 = dVar2 * 0.0006000000000000001;
        dVar4 = sin(dVar3);
        local_368 = sin(dVar4 * 42.0);
        dVar4 = sin(dVar3);
        dStack_360 = sin(dVar4 * -43.0);
        dVar4 = sin(dVar2 * 0.00030000000000000003);
        local_358 = cos(dVar4 * 83.0);
        dVar4 = sin(dVar2 * 0.0015);
        dVar4 = sin(dVar4 * 0.2);
        local_370 = sin(dVar4 * 97.0);
        local_370 = local_370 * 4.0;
        sch::S_Object::setOrientation(*(double **)(local_2b8 + 8),(Vector3T *)&local_370);
        pVVar1 = *(Vector3T **)(local_2b8 + 8);
        dVar4 = sin(dVar3);
        dVar4 = sin(dVar4 * 20.0);
        local_338._8_4_ = extraout_XMM0_Dc_02;
        local_338._0_8_ = dVar4;
        local_338._12_4_ = extraout_XMM0_Dd_02;
        dVar2 = sin(dVar2 * 0.00045);
        dVar2 = sin(dVar2 * -69.0);
        dVar3 = sin(dVar3);
        dVar3 = sin(dVar3 * 20.0);
        local_328 = (double)local_338._0_8_ * 0.6 + local_308;
        dStack_320 = dVar2 * 0.6 + dStack_300;
        local_318 = dVar3 * 0.6 + local_2f8;
        sch::S_Object::setPosition(pVVar1);
        lVar13 = lVar13 + 1;
      } while (lVar13 != 10000);
      local_348._0_8_ = cVar9;
      cVar9 = clock();
      cVar10 = clock();
      lVar13 = 0;
      do {
        dVar2 = (double)lVar13;
        dVar3 = dVar2 * 0.0006000000000000001;
        dVar4 = sin(dVar3);
        local_368 = sin(dVar4 * 42.0);
        dVar4 = sin(dVar3);
        dStack_360 = sin(dVar4 * -43.0);
        dVar4 = sin(dVar2 * 0.00030000000000000003);
        local_358 = cos(dVar4 * 83.0);
        dVar4 = sin(dVar2 * 0.0015);
        dVar4 = sin(dVar4 * 0.2);
        local_370 = sin(dVar4 * 97.0);
        local_370 = local_370 * 4.0;
        sch::S_Object::setOrientation(*(double **)(local_2b8 + 8),(Vector3T *)&local_370);
        pVVar1 = *(Vector3T **)(local_2b8 + 8);
        dVar4 = sin(dVar3);
        dVar4 = sin(dVar4 * 20.0);
        local_338._8_4_ = extraout_XMM0_Dc_03;
        local_338._0_8_ = dVar4;
        local_338._12_4_ = extraout_XMM0_Dd_03;
        dVar2 = sin(dVar2 * 0.00045);
        dVar2 = sin(dVar2 * -69.0);
        dVar3 = sin(dVar3);
        dVar3 = sin(dVar3 * 20.0);
        local_328 = (double)local_338._0_8_ * 0.6 + local_308;
        dStack_320 = dVar2 * 0.6 + dStack_300;
        local_318 = dVar3 * 0.6 + local_2f8;
        sch::S_Object::setPosition(pVVar1);
        sch::CD_Scene::sceneProximityQuery();
        display();
        lVar13 = lVar13 + 1;
      } while (lVar13 != 10000);
      cVar11 = clock();
      dVar2 = (double)((local_348._0_8_ - (cVar9 + cVar10)) + cVar11) / 1000000.0;
      poVar12 = std::ostream::_M_insert<double>(dVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
      poVar12 = std::ostream::_M_insert<double>(dVar2 / 10000.0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      poVar12 = std::ostream::_M_insert<double>(dVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
      poVar12 = std::ostream::_M_insert<double>(dVar2 / 10000.0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      sch::CD_Scene::~CD_Scene(local_2c0);
      uVar14 = uVar14 + 1;
    } while (uVar14 < (ulong)(((long)(local_2e8->stppObjects).
                                     super__Vector_base<sch::STP_BV_P,_std::allocator<sch::STP_BV_P>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(local_2e8->stppObjects).
                                     super__Vector_base<sch::STP_BV_P,_std::allocator<sch::STP_BV_P>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x7063e7063e7063e7));
  }
  std::fstream::close();
  std::fstream::~fstream(&local_240);
  return;
}

Assistant:

void TestMaterial::GeneralTest()
{
  std::fstream outfile;
  outfile.open("/tmp/sch_generaltest_result.txt",std::ios_base::out|std::ios_base::trunc);
  outfile.precision(18);


  for (size_t k=0; k<stppObjects.size(); k++)
  {
    CD_Scene testscene;
    testscene.addObject(sObj[0]);

    sObj[0]->resetTransformation();

    testscene.addObject(&(stppObjects[k]));

    Vector3 position(
      (1.+7%5-3.),
      ((5%6-3)*(5.0/6)),
      ((5%7-3)*(5.0/7))
    );
    position *= DispersionScale;

    Vector3 axe(0, 0, 1);
    double angle(0);

    testscene[1]->setOrientation(angle,axe);
    testscene[1]->setPosition(position);

    testscene.sceneProximityQuery();

    display();

    clock_t begin, end;

    begin=clock();
    for (long j=0; j<RandomTestEnd; j++)
    {
      double a = (rand()/double(RAND_MAX)) ;
      double b = (rand()/double(RAND_MAX)) ;
      double c = (rand()/double(RAND_MAX)) ;
      double d = (rand()/double(RAND_MAX)) ;
      Vector3 v(sqrt(-2*log(a))*cos(2*PI*b),sqrt(-2*log(b))*cos(2*PI*a),sqrt(-2*log(c))*cos(2*PI*d));
    }
    end=clock();

    clock_t lostTime=end-begin;

    begin=clock();
    for (long j=0; j<RandomTestEnd; j++)
    {
      double a = (rand()/double(RAND_MAX)) ;
      double b = (rand()/double(RAND_MAX)) ;
      double c = (rand()/double(RAND_MAX)) ;
      double d = (rand()/double(RAND_MAX)) ;

      Vector3 v(sqrt(-2*log(a))*cos(2*PI*b),sqrt(-2*log(b))*cos(2*PI*a),sqrt(-2*log(c))*cos(2*PI*d));

#ifdef DO_TEST
      Point3 p=testscene[1]->support(v);

# ifndef OUTPUT_FILE
      (void) p;
#else
      outfile<<p<<std::endl;
# endif // OUTPUT_FILE

#endif // DO_TEST
    }

#ifdef OUTPUT_FILE
    outfile.close();
#endif

    end=clock();


    begin=clock();

    for (long i=0; i<AnimationEnd; i++)
    {
      Scalar is= Scalar(i);
      axe[0] =  sin((42)*sin(0.2*AnimationSpeed*is));
      axe[1] =  sin((-43)*sin(0.2*AnimationSpeed*is));
      axe[2] =  cos((83)*sin(0.1*AnimationSpeed*is));

      angle=4*sin((97)*sin(0.2*sin(0.5*AnimationSpeed*is)));

      testscene[1]->setOrientation(angle,axe);

      testscene[1]->setPosition( position + Vector3(sin((20*(1))*sin(0.2*AnimationSpeed*is)),
                                 sin((71-140*(1))*sin(0.15*AnimationSpeed*is)),
                                 sin((20)*sin(0.2*AnimationSpeed*is)))*AnimationScale);
    }

    end=clock();

    lostTime=end-begin;

    begin=clock();

    for (long i=0; i<AnimationEnd; i++)
    {
      Scalar is = Scalar(i);
      axe[0] =  sin((42)*sin(0.2*AnimationSpeed*is));
      axe[1] =  sin((-43)*sin(0.2*AnimationSpeed*is));
      axe[2] =  cos((83)*sin(0.1*AnimationSpeed*is));

      angle=4*sin((97)*sin(0.2*sin(0.5*AnimationSpeed*is)));

      testscene[1]->setOrientation(angle,axe);

      testscene[1]->setPosition( position + Vector3(sin((20*(1))*sin(0.2*AnimationSpeed*is)),
                                 sin((71-140*(1))*sin(0.15*AnimationSpeed*is)),
                                 sin((20)*sin(0.2*AnimationSpeed*is)))*AnimationScale);

#ifdef DO_TEST
      testscene.sceneProximityQuery();
#endif

#ifdef TEST_HOLD
      std::cout<<i<<std::endl;
      system("pause");
#endif

      display();
    }
    end=clock();
    outfile   <<((double)(end- begin-lostTime) / CLOCKS_PER_SEC) << " " << ((double)(end - begin-lostTime) / CLOCKS_PER_SEC)/(AnimationEnd) <<  std::endl;
    std::cout <<((double)(end- begin-lostTime) / CLOCKS_PER_SEC) << " " << ((double)(end - begin-lostTime) / CLOCKS_PER_SEC)/(AnimationEnd) <<  std::endl;
  }
  outfile.close();
}